

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::EndGroup(XmlReporter *this,string *param_1,Totals *totals)

{
  ScopedElement *pSVar1;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [16];
  Totals *totals_local;
  string *param_1_local;
  XmlReporter *this_local;
  
  local_28._8_8_ = totals;
  totals_local = (Totals *)param_1;
  param_1_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"OverallResults",&local_49);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"successes",&local_81);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     ((ScopedElement *)local_28,(string *)local_80,(unsigned_long *)local_28._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"failures",&local_a9);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     (pSVar1,(string *)local_a8,&((Counts *)local_28._8_8_)->failed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"expectedFailures",&local_d1);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (pSVar1,(string *)local_d0,&((Counts *)local_28._8_8_)->failedButOk);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void EndGroup( const std::string&, const Totals& totals ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", totals.assertions.passed )
                .writeAttribute( "failures", totals.assertions.failed )
                .writeAttribute( "expectedFailures", totals.assertions.failedButOk );
            m_xml.endElement();
        }